

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lookup.cpp
# Opt level: O1

void slang::ast::Lookup::qualified
               (ScopedNameSyntax *syntax,ASTContext *context,bitmask<slang::ast::LookupFlags> flags,
               LookupResult *result)

{
  SourceRange *pSVar1;
  pointer pNVar2;
  char *pcVar3;
  Scope *originalScope;
  Compilation *this;
  optional<slang::SourceRange> sourceRange;
  optional<slang::SourceRange> sourceRange_00;
  NameComponents name;
  NameComponents name_00;
  SourceRange range;
  SourceRange range_00;
  SourceRange range_01;
  span<const_slang::ast::(anonymous_namespace)::NamePlusLoc,_18446744073709551615UL> nameParts_00;
  span<const_slang::ast::(anonymous_namespace)::NamePlusLoc,_18446744073709551615UL> nameParts_01;
  char *pcVar4;
  bool bVar5;
  NameSyntax *name_01;
  RootSymbol *pRVar6;
  Diagnostic *this_00;
  Symbol *pSVar7;
  SymbolIndex SVar8;
  LookupResult *ctx;
  LookupResult *in_R9;
  SyntaxKind SVar9;
  uint uVar10;
  Scope *scope;
  SourceRange range_02;
  SourceRange range_03;
  LookupLocation location;
  SourceRange range_04;
  LookupLocation location_00;
  string_view arg;
  string_view name_02;
  span<const_slang::ast::(anonymous_namespace)::NamePlusLoc,_18446744073709551615UL> nameParts_02;
  string_view name_03;
  int colonParts;
  NameComponents first;
  SmallVector<slang::ast::(anonymous_namespace)::NamePlusLoc,_4UL> nameParts;
  LookupResult originalResult;
  underlying_type in_stack_fffffffffffffb88;
  bitmask<slang::ast::LookupFlags> flags_00;
  undefined4 in_stack_fffffffffffffb8c;
  int local_434;
  char *local_430;
  NameComponents local_428;
  LookupResult *local_3f0;
  SourceLocation local_3e8;
  SourceLocation SStack_3e0;
  undefined1 local_3d8;
  undefined7 uStack_3d7;
  SourceLocation local_3c8;
  SourceLocation SStack_3c0;
  undefined1 local_3b8;
  undefined7 uStack_3b7;
  SmallVectorBase<slang::ast::(anonymous_namespace)::NamePlusLoc> local_3b0 [3];
  LookupResult local_278;
  
  local_434 = 0;
  local_3b0[0].data_ = (pointer)local_3b0[0].firstElement;
  local_3b0[0].len = 0;
  local_3b0[0].cap = 4;
  name_01 = anon_unknown_39::splitScopedName(syntax,local_3b0,&local_434);
  SVar9 = (name_01->super_ExpressionSyntax).super_SyntaxNode.kind;
  anon_unknown_39::NameComponents::NameComponents(&local_428,name_01);
  originalScope = (context->scope).ptr;
  this = originalScope->compilation;
  if (SVar9 == LocalScope) {
    if ((context->randomizeDetails == (RandomizeDetails *)0x0) ||
       (context->randomizeDetails->classType == (Scope *)0x0)) {
      range.endLoc = local_428.range.endLoc;
      range.startLoc = local_428.range.startLoc;
      Diagnostics::add(&result->diagnostics,originalScope->thisSym,(DiagCode)0x18000a,range);
      pcVar4 = local_430;
      goto LAB_002dfd11;
    }
    local_428.text._M_len =
         local_3b0[0].data_
         [(long)((((LookupResult *)(local_3b0[0].len + -0x240))->diagnostics).
                 super_SmallVector<slang::Diagnostic,_2UL>.stackBase + 0x6f)].name.text._M_len;
    local_428.text._M_str =
         local_3b0[0].data_
         [(long)((((LookupResult *)(local_3b0[0].len + -0x240))->diagnostics).
                 super_SmallVector<slang::Diagnostic,_2UL>.stackBase + 0x6f)].name.text._M_str;
    pSVar1 = &local_3b0[0].data_
              [(long)((((LookupResult *)(local_3b0[0].len + -0x240))->diagnostics).
                      super_SmallVector<slang::Diagnostic,_2UL>.stackBase + 0x6f)].name.range;
    local_428.range.startLoc = pSVar1->startLoc;
    local_428.range.endLoc = pSVar1->endLoc;
    local_428.selectors._M_ptr =
         local_3b0[0].data_
         [(long)((((LookupResult *)(local_3b0[0].len + -0x240))->diagnostics).
                 super_SmallVector<slang::Diagnostic,_2UL>.stackBase + 0x6f)].name.selectors._M_ptr;
    local_428.selectors._M_extent._M_extent_value =
         local_3b0[0].data_
         [(long)((((LookupResult *)(local_3b0[0].len + -0x240))->diagnostics).
                 super_SmallVector<slang::Diagnostic,_2UL>.stackBase + 0x6f)].name.selectors.
         _M_extent._M_extent_value;
    local_428.paramAssignments =
         local_3b0[0].data_
         [(long)((((LookupResult *)(local_3b0[0].len + -0x240))->diagnostics).
                 super_SmallVector<slang::Diagnostic,_2UL>.stackBase + 0x6f)].name.paramAssignments;
    SVar9 = local_3b0[0].data_
            [(long)((((LookupResult *)(local_3b0[0].len + -0x240))->diagnostics).
                    super_SmallVector<slang::Diagnostic,_2UL>.stackBase + 0x6f)].kind;
    local_3b0[0].len =
         (size_type)
         ((((LookupResult *)(local_3b0[0].len + -0x240))->diagnostics).
          super_SmallVector<slang::Diagnostic,_2UL>.stackBase + 0x6f);
    if (local_434 != 0) {
      local_434 = local_434 + -1;
    }
  }
  pcVar4 = local_428.text._M_str;
  local_3f0 = (LookupResult *)local_428.text._M_len;
  if ((LookupResult *)local_428.text._M_len == (LookupResult *)0x0) goto LAB_002dfd11;
  flags_00.m_bits = local_428.range.startLoc._0_4_;
  local_430 = local_428.text._M_str;
  if ((int)SVar9 < 0xe5) {
    uVar10 = SVar9 - ArrayAndMethod;
    if (((0x34 < uVar10) || ((0x1bUL >> ((ulong)uVar10 & 0x3f) & 1) != 0)) ||
       ((ulong)uVar10 != 0x34)) {
      range_00.endLoc = local_428.range.endLoc;
      range_00.startLoc = local_428.range.startLoc;
      this_00 = Diagnostics::add(&result->diagnostics,originalScope->thisSym,(DiagCode)0x35000a,
                                 range_00);
      arg._M_str = local_430;
      arg._M_len = (size_t)local_3f0;
      Diagnostic::operator<<(this_00,arg);
      pcVar4 = local_430;
      goto LAB_002dfd11;
    }
LAB_002df9a6:
    local_3c8 = local_428.range.startLoc;
    SStack_3c0 = local_428.range.endLoc;
    local_3b8 = 1;
    sourceRange.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
    super__Optional_payload_base<slang::SourceRange>._17_7_ = uStack_3b7;
    sourceRange.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
    super__Optional_payload_base<slang::SourceRange>._M_engaged = true;
    in_stack_fffffffffffffb8c = local_428.range.startLoc._4_4_;
    sourceRange.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
    super__Optional_payload_base<slang::SourceRange>._M_payload._M_value.endLoc =
         local_428.range.endLoc;
    sourceRange.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
    super__Optional_payload_base<slang::SourceRange>._M_payload._M_value.startLoc =
         local_428.range.startLoc;
    location.index = context->lookupIndex;
    location.scope = (Scope *)local_428.text._M_len;
    location._12_4_ = 0;
    name_02._M_str = local_428.text._M_str;
    name_02._M_len = local_428.text._M_len;
    unqualifiedImpl(originalScope,name_02,location,sourceRange,flags,0,result,originalScope,
                    (SyntaxNode *)0x0);
    in_stack_fffffffffffffb88 = flags_00.m_bits;
  }
  else {
    if ((int)SVar9 < 0x1c5) {
      if (1 < SVar9 - IdentifierName) {
        pcVar4 = local_428.text._M_str;
        if ((SVar9 != LocalScope) &&
           (bVar5 = Scope::isUninstantiated(originalScope), pcVar4 = local_430, !bVar5)) {
          pRVar6 = Compilation::getRoot(this);
          result->found = &pRVar6->super_Symbol;
          nameParts_00._M_extent._M_extent_value = local_3b0[0].len;
          nameParts_00._M_ptr = local_3b0[0].data_;
          name.text._M_str = local_428.text._M_str;
          name.text._M_len = local_428.text._M_len;
          name.range.startLoc = local_428.range.startLoc;
          name.range.endLoc._0_4_ = local_428.range.endLoc._0_4_;
          name.range.endLoc._4_4_ = local_428.range.endLoc._4_4_;
          name.selectors._M_ptr = local_428.selectors._M_ptr;
          name.selectors._M_extent._M_extent_value = local_428.selectors._M_extent._M_extent_value;
          name.paramAssignments = local_428.paramAssignments;
          anon_unknown_39::lookupDownward(nameParts_00,name,context,flags,result);
          pcVar4 = local_430;
        }
        goto LAB_002dfd11;
      }
      goto LAB_002df9a6;
    }
    if (SVar9 == SuperHandle) {
      range_04.endLoc = (SourceLocation)result;
      range_04.startLoc = local_428.range.endLoc;
      pSVar7 = anon_unknown_39::findSuperHandle
                         ((anon_unknown_39 *)originalScope,(Scope *)(ulong)flags.m_bits,flags_00,
                          range_04,in_R9);
LAB_002dfa2b:
      result->found = pSVar7;
      local_434 = 1;
    }
    else if (SVar9 == ThisHandle) {
      range_02.endLoc = (SourceLocation)result;
      range_02.startLoc = local_428.range.endLoc;
      pSVar7 = anon_unknown_39::findThisHandle
                         ((anon_unknown_39 *)originalScope,(Scope *)(ulong)flags.m_bits,flags_00,
                          range_02,in_R9);
      result->found = pSVar7;
      if ((pSVar7 != (Symbol *)0x0) &&
         (local_3b0[0].data_
          [(long)((((LookupResult *)(local_3b0[0].len + -0x240))->diagnostics).
                  super_SmallVector<slang::Diagnostic,_2UL>.stackBase + 0x6f)].kind == SuperHandle))
      {
        local_428.text._M_len =
             local_3b0[0].data_
             [(long)((((LookupResult *)(local_3b0[0].len + -0x240))->diagnostics).
                     super_SmallVector<slang::Diagnostic,_2UL>.stackBase + 0x6f)].name.text._M_len;
        local_428.text._M_str =
             local_3b0[0].data_
             [(long)((((LookupResult *)(local_3b0[0].len + -0x240))->diagnostics).
                     super_SmallVector<slang::Diagnostic,_2UL>.stackBase + 0x6f)].name.text._M_str;
        local_428.range.startLoc =
             local_3b0[0].data_
             [(long)((((LookupResult *)(local_3b0[0].len + -0x240))->diagnostics).
                     super_SmallVector<slang::Diagnostic,_2UL>.stackBase + 0x6f)].name.range.
             startLoc;
        local_428.range.endLoc =
             local_3b0[0].data_
             [(long)((((LookupResult *)(local_3b0[0].len + -0x240))->diagnostics).
                     super_SmallVector<slang::Diagnostic,_2UL>.stackBase + 0x6f)].name.range.endLoc;
        local_428.selectors._M_ptr =
             local_3b0[0].data_
             [(long)((((LookupResult *)(local_3b0[0].len + -0x240))->diagnostics).
                     super_SmallVector<slang::Diagnostic,_2UL>.stackBase + 0x6f)].name.selectors.
             _M_ptr;
        local_428.selectors._M_extent._M_extent_value =
             local_3b0[0].data_
             [(long)((((LookupResult *)(local_3b0[0].len + -0x240))->diagnostics).
                     super_SmallVector<slang::Diagnostic,_2UL>.stackBase + 0x6f)].name.selectors.
             _M_extent._M_extent_value;
        local_428.paramAssignments =
             local_3b0[0].data_
             [(long)((((LookupResult *)(local_3b0[0].len + -0x240))->diagnostics).
                     super_SmallVector<slang::Diagnostic,_2UL>.stackBase + 0x6f)].name.
             paramAssignments;
        local_3b0[0].len =
             (size_type)
             ((((LookupResult *)(local_3b0[0].len + -0x240))->diagnostics).
              super_SmallVector<slang::Diagnostic,_2UL>.stackBase + 0x6f);
        range_03.endLoc = (SourceLocation)result;
        range_03.startLoc = local_428.range.endLoc;
        pSVar7 = anon_unknown_39::findSuperHandle
                           ((anon_unknown_39 *)originalScope,(Scope *)(ulong)flags.m_bits,
                            (bitmask<slang::ast::LookupFlags>)local_428.range.startLoc._0_4_,
                            range_03,in_R9);
        goto LAB_002dfa2b;
      }
    }
    else {
      pNVar2 = local_3b0[0].data_ +
               (long)((((LookupResult *)(local_3b0[0].len + -0x240))->diagnostics).
                      super_SmallVector<slang::Diagnostic,_2UL>.stackBase + 0x6f);
      local_428.text._M_len = (pNVar2->name).text._M_len;
      local_430 = (pNVar2->name).text._M_str;
      pSVar1 = &local_3b0[0].data_
                [(long)((((LookupResult *)(local_3b0[0].len + -0x240))->diagnostics).
                        super_SmallVector<slang::Diagnostic,_2UL>.stackBase + 0x6f)].name.range;
      local_428.range.startLoc = pSVar1->startLoc;
      local_428.range.endLoc =
           local_3b0[0].data_
           [(long)((((LookupResult *)(local_3b0[0].len + -0x240))->diagnostics).
                   super_SmallVector<slang::Diagnostic,_2UL>.stackBase + 0x6f)].name.range.endLoc;
      local_428.selectors._M_ptr =
           local_3b0[0].data_
           [(long)((((LookupResult *)(local_3b0[0].len + -0x240))->diagnostics).
                   super_SmallVector<slang::Diagnostic,_2UL>.stackBase + 0x6f)].name.selectors.
           _M_ptr;
      local_428.selectors._M_extent._M_extent_value =
           local_3b0[0].data_
           [(long)((((LookupResult *)(local_3b0[0].len + -0x240))->diagnostics).
                   super_SmallVector<slang::Diagnostic,_2UL>.stackBase + 0x6f)].name.selectors.
           _M_extent._M_extent_value;
      local_428.paramAssignments =
           local_3b0[0].data_
           [(long)((((LookupResult *)(local_3b0[0].len + -0x240))->diagnostics).
                   super_SmallVector<slang::Diagnostic,_2UL>.stackBase + 0x6f)].name.
           paramAssignments;
      local_3b0[0].len =
           (size_type)
           ((((LookupResult *)(local_3b0[0].len + -0x240))->diagnostics).
            super_SmallVector<slang::Diagnostic,_2UL>.stackBase + 0x6f);
      if (local_434 != 0) {
        local_434 = local_434 + -1;
      }
      pcVar4 = local_428.text._M_str;
      local_428.text._M_str = local_430;
      local_3f0 = (LookupResult *)local_428.text._M_len;
      if ((LookupResult *)local_428.text._M_len == (LookupResult *)0x0) goto LAB_002dfd11;
      SVar8 = context->lookupIndex;
      scope = originalScope;
      do {
        pSVar7 = scope->thisSym;
        if (pSVar7->kind == CompilationUnit) {
          local_3d8 = 1;
          sourceRange_00.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
          super__Optional_payload_base<slang::SourceRange>._17_7_ = uStack_3d7;
          sourceRange_00.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
          super__Optional_payload_base<slang::SourceRange>._M_engaged = true;
          in_stack_fffffffffffffb88 = local_428.range.startLoc._0_4_;
          in_stack_fffffffffffffb8c = local_428.range.startLoc._4_4_;
          sourceRange_00.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
          super__Optional_payload_base<slang::SourceRange>._M_payload =
               *(_Storage<slang::SourceRange,_true> *)pSVar1;
          location_00.index = SVar8;
          location_00.scope = (Scope *)local_428.text._M_len;
          location_00._12_4_ = 0;
          local_3e8 = local_428.range.startLoc;
          SStack_3e0 = local_428.range.endLoc;
          unqualifiedImpl(scope,(pNVar2->name).text,location_00,sourceRange_00,flags,0,result,
                          originalScope,(SyntaxNode *)0x0);
          break;
        }
        scope = pSVar7->parentScope;
        SVar8 = pSVar7->indexInScope + 1;
      } while (scope != (Scope *)0x0);
    }
  }
  bVar5 = LookupResult::hasError(result);
  pcVar4 = local_430;
  if (bVar5) goto LAB_002dfd11;
  if (local_434 != 0) {
    anon_unknown_39::resolveColonNames(local_3b0,local_434,&local_428,flags,result,context);
    pcVar4 = local_430;
    goto LAB_002dfd11;
  }
  pcVar3 = local_278.selectors.
           super_SmallVectorBase<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_>
           .firstElement;
  local_278.found = (Symbol *)0x0;
  local_278.systemSubroutine._0_5_ = 0;
  local_278.systemSubroutine._5_3_ = 0;
  local_278.upwardCount = 0;
  local_278.flags.m_bits = '\0';
  local_278.selectors.
  super_SmallVectorBase<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_>
  .len = 0;
  local_278.selectors.
  super_SmallVectorBase<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_>
  .cap = 4;
  pcVar4 = local_278.path.super_SmallVectorBase<slang::ast::HierarchicalReference::Element>.
           firstElement;
  local_278.path.super_SmallVectorBase<slang::ast::HierarchicalReference::Element>.len = 0;
  local_278.path.super_SmallVectorBase<slang::ast::HierarchicalReference::Element>.cap = 2;
  local_278.diagnostics.super_SmallVector<slang::Diagnostic,_2UL>.
  super_SmallVectorBase<slang::Diagnostic>.data_ =
       (pointer)local_278.diagnostics.super_SmallVector<slang::Diagnostic,_2UL>.
                super_SmallVectorBase<slang::Diagnostic>.firstElement;
  local_278.diagnostics.super_SmallVector<slang::Diagnostic,_2UL>.
  super_SmallVectorBase<slang::Diagnostic>.len = 0;
  local_278.diagnostics.super_SmallVector<slang::Diagnostic,_2UL>.
  super_SmallVectorBase<slang::Diagnostic>.cap = 2;
  local_278.selectors.
  super_SmallVectorBase<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_>
  .data_ = (pointer)pcVar3;
  local_278.path.super_SmallVectorBase<slang::ast::HierarchicalReference::Element>.data_ =
       (pointer)pcVar4;
  if (result->found == (Symbol *)0x0) {
LAB_002dfc59:
    nameParts_02._M_extent._M_extent_value = (size_t)&local_428;
    nameParts_02._M_ptr = (pointer)local_3b0[0].len;
    ctx = (LookupResult *)local_3b0[0].len;
    bVar5 = anon_unknown_39::lookupUpward
                      ((anon_unknown_39 *)local_3b0[0].data_,nameParts_02,(NameComponents *)context,
                       (ASTContext *)(ulong)flags.m_bits,
                       (bitmask<slang::ast::LookupFlags>)(underlying_type)result,
                       (LookupResult *)CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88)
                      );
    if (bVar5 && result->found == (Symbol *)0x0) {
      ctx = &local_278;
      LookupResult::operator=(result,ctx);
      if ((result->found == (Symbol *)0x0) && (bVar5 = LookupResult::hasError(result), !bVar5)) {
        range_01.endLoc = local_428.range.endLoc;
        range_01.startLoc = local_428.range.startLoc;
        name_03._M_str = local_430;
        name_03._M_len = (size_t)local_3f0;
        ctx = local_3f0;
        reportUndeclared(originalScope,name_03,range_01,
                         (bitmask<slang::ast::LookupFlags>)(flags.m_bits | 0x10),true,result);
      }
    }
  }
  else {
    nameParts_01._M_extent._M_extent_value = local_3b0[0].len;
    nameParts_01._M_ptr = local_3b0[0].data_;
    in_stack_fffffffffffffb88 = (underlying_type)local_428.text._M_len;
    in_stack_fffffffffffffb8c = (undefined4)(local_428.text._M_len >> 0x20);
    name_00.text._M_str = local_428.text._M_str;
    name_00.text._M_len = local_428.text._M_len;
    name_00.range.startLoc = local_428.range.startLoc;
    name_00.range.endLoc._0_4_ = local_428.range.endLoc._0_4_;
    name_00.range.endLoc._4_4_ = local_428.range.endLoc._4_4_;
    name_00.selectors._M_ptr = local_428.selectors._M_ptr;
    name_00.selectors._M_extent._M_extent_value = local_428.selectors._M_extent._M_extent_value;
    name_00.paramAssignments = local_428.paramAssignments;
    ctx = (LookupResult *)local_3b0[0].len;
    bVar5 = anon_unknown_39::lookupDownward(nameParts_01,name_00,context,flags,result);
    if ((bVar5 && result->found == (Symbol *)0x0) && (((result->flags).m_bits & 1) == 0)) {
      LookupResult::operator=(&local_278,result);
      goto LAB_002dfc59;
    }
  }
  SmallVectorBase<slang::Diagnostic>::cleanup
            ((SmallVectorBase<slang::Diagnostic> *)&local_278.diagnostics,(EVP_PKEY_CTX *)ctx);
  if (local_278.path.super_SmallVectorBase<slang::ast::HierarchicalReference::Element>.data_ !=
      (pointer)pcVar4) {
    operator_delete(local_278.path.super_SmallVectorBase<slang::ast::HierarchicalReference::Element>
                    .data_);
  }
  pcVar4 = local_430;
  if (local_278.selectors.
      super_SmallVectorBase<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_>
      .data_ != (pointer)pcVar3) {
    operator_delete(local_278.selectors.
                    super_SmallVectorBase<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_>
                    .data_);
    pcVar4 = local_430;
  }
LAB_002dfd11:
  local_430 = pcVar4;
  if (local_3b0[0].data_ != (pointer)local_3b0[0].firstElement) {
    operator_delete(local_3b0[0].data_);
  }
  return;
}

Assistant:

void Lookup::qualified(const ScopedNameSyntax& syntax, const ASTContext& context,
                       bitmask<LookupFlags> flags, LookupResult& result) {
    // Split the name into easier to manage chunks. The parser will always produce a
    // left-recursive name tree, so that's all we'll bother to handle.
    int colonParts = 0;
    SmallVector<NamePlusLoc, 4> nameParts;
    auto leftMost = splitScopedName(syntax, nameParts, colonParts);

    SyntaxKind firstKind = leftMost->kind;
    NameComponents first = *leftMost;
    auto name = first.text;

    auto popFront = [&] {
        first = nameParts.back().name;
        firstKind = nameParts.back().kind;
        nameParts.pop_back();
        name = first.text;
        if (colonParts)
            colonParts--;
    };

    auto& scope = *context.scope;
    auto& compilation = context.getCompilation();

    if (firstKind == SyntaxKind::LocalScope) {
        if (!context.randomizeDetails || !context.randomizeDetails->classType) {
            result.addDiag(scope, diag::LocalNotAllowed, first.range);
            return;
        }

        // The local:: is allowed here. Pop it and look up the rest of
        // the name as if the local hadn't been specified -- the local
        // lookup portion has already been ensured because we exited
        // early from withinClassRandomize.
        popFront();
    }

    if (name.empty())
        return;

    switch (firstKind) {
        case SyntaxKind::IdentifierName:
        case SyntaxKind::IdentifierSelectName:
        case SyntaxKind::ClassName:
            // Start by trying to find the first name segment using normal unqualified lookup
            unqualifiedImpl(scope, name, context.getLocation(), first.range, flags, {}, result,
                            scope, nullptr);
            break;
        case SyntaxKind::UnitScope: {
            // Walk upward to find the compilation unit scope.
            popFront();
            if (name.empty())
                return;

            const Scope* current = &scope;
            LookupLocation location = context.getLocation();
            do {
                auto& symbol = current->asSymbol();
                if (symbol.kind == SymbolKind::CompilationUnit) {
                    unqualifiedImpl(*current, name, location, first.range, flags, {}, result, scope,
                                    nullptr);
                    break;
                }

                location = LookupLocation::after(symbol);
                current = location.getScope();
            } while (current);

            break;
        }
        case SyntaxKind::RootScope:
            // Ignore hierarchical lookups that occur inside uninstantiated modules.
            if (scope.isUninstantiated())
                return;

            result.found = &compilation.getRoot();
            lookupDownward(nameParts, first, context, flags, result);
            return;
        case SyntaxKind::ThisHandle:
            result.found = findThisHandle(scope, flags, first.range, result);
            if (result.found && nameParts.back().kind == SyntaxKind::SuperHandle) {
                // Handle "this.super.whatever" the same as if the user had just
                // written "super.whatever".
                first = nameParts.back().name;
                nameParts.pop_back();
                result.found = findSuperHandle(scope, flags, first.range, result);
                colonParts = 1;
            }
            break;
        case SyntaxKind::SuperHandle:
            result.found = findSuperHandle(scope, flags, first.range, result);
            colonParts = 1; // pretend we used colon access to resolve class scoped name
            break;
        case SyntaxKind::LocalScope:
            // This is only reachable in invalid code. An error has already been
            // reported so early out.
            return;
        case SyntaxKind::ArrayUniqueMethod:
        case SyntaxKind::ArrayAndMethod:
        case SyntaxKind::ArrayOrMethod:
        case SyntaxKind::ArrayXorMethod:
        case SyntaxKind::ConstructorName:
            result.addDiag(scope, diag::UnexpectedNameToken, first.range) << name;
            return;
        default:
            SLANG_UNREACHABLE;
    }

    if (result.hasError())
        return;

    // [23.7.1] If we are starting with a colon separator, always do a downwards name
    // resolution.
    if (colonParts) {
        resolveColonNames(nameParts, colonParts, first, flags, result, context);
        return;
    }

    // [23.7] lists the possible cases for dotted names:
    // 1. The name resolves to a value symbol. The dotted name is a member select.
    // 2. The name resolves to a local scope. The dotted name is a hierarchical reference.
    // 3. The name resolves to an imported scope. The dotted name is a hierarchical reference,
    //    but with an added restriction that only a direct downward lookup from the package is
    //    allowed.
    // 4. The name is not found; it's considered a hierarchical reference and participates in
    //    upwards name resolution.

    LookupResult originalResult;
    if (result.found) {
        // Perform the downward lookup.
        if (!lookupDownward(nameParts, first, context, flags, result))
            return;

        // If we found a symbol, we're done with lookup. In case (1) above we'll always have a
        // found symbol here. Otherwise, if we're in case (2) we need to do further upwards name
        // lookup. If we're in case (3) we've already issued an error and just need to give up.
        if (result.found || result.flags.has(LookupResultFlags::WasImported))
            return;

        originalResult = result;
    }

    // If we reach this point we're in case (2) or (4) above. Go up through the instantiation
    // hierarchy and see if we can find a match there.
    if (!lookupUpward(nameParts, first, context, flags, result))
        return;

    if (result.found)
        return;

    // We couldn't find anything. originalResult has any diagnostics issued by the first
    // downward lookup (if any), so it's fine to just return it as is. If we never found any
    // symbol originally, issue an appropriate error for that.
    result = originalResult;
    if (!result.found && !result.hasError()) {
        reportUndeclared(scope, name, first.range,
                         flags | LookupFlags::NoUndeclaredErrorIfUninstantiated, true, result);
    }
}